

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::SimpleAssertionExpr::fromSyntax
          (SimpleSequenceExprSyntax *syntax,ASTContext *context,bool allowDisable)

{
  Compilation *this;
  Type *this_00;
  SyntaxNode *this_01;
  int iVar1;
  Expression *expr;
  Type *pTVar2;
  Diagnostic *this_02;
  SourceLocation SVar3;
  SimpleAssertionExpr *pSVar4;
  DiagCode code;
  AssertionInstanceExpression *aie;
  SourceRange SVar5;
  optional<slang::ast::SequenceRepetition> repetition;
  ConstantValue evaluatedValue;
  bool local_6d;
  _Storage<slang::ast::SequenceRepetition,_true> local_6c;
  undefined1 local_5c;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  this = ((context->scope).ptr)->compilation;
  expr = bindExpr((syntax->expr).ptr,context,true,true);
  local_5c = 0;
  if (syntax->repetition == (SequenceRepetitionSyntax *)0x0) {
    if (expr->kind == AssertionInstance && !allowDisable) {
      SVar3 = (SourceLocation)expr[1].type.ptr;
      iVar1 = *(int *)SVar3;
      if (iVar1 == 7) {
        SVar3 = *(SourceLocation *)((long)SVar3 + 0x18);
        iVar1 = *(int *)SVar3;
      }
      if (iVar1 == 0xc) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        this_02 = ASTContext::addDiag(context,(DiagCode)0x2d0008,SVar5);
        Diagnostic::operator<<(this_02,*(string_view *)(*(long *)(expr + 1) + 8));
        this_01 = (SyntaxNode *)((string_view *)((long)SVar3 + 8))->_M_len;
        if (this_01 != (SyntaxNode *)0x0) {
          local_58._M_rest._0_16_ =
               (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(this_01);
          SVar3 = parsing::Token::location((Token *)&local_58);
          Diagnostic::addNote(this_02,(DiagCode)0x50001,SVar3);
        }
      }
    }
  }
  else {
    SequenceRepetition::SequenceRepetition(&local_6c._M_value,syntax->repetition,context);
    local_5c = 1;
    if (expr->kind == AssertionInstance) {
      this_00 = (expr->type).ptr;
      pTVar2 = this_00->canonical;
      if (pTVar2 == (Type *)0x0) {
        Type::resolveCanonical(this_00);
        pTVar2 = this_00->canonical;
      }
      if ((pTVar2->super_Symbol).kind == PropertyType) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&syntax->repetition->super_SyntaxNode);
        code.subsystem = Statements;
        code.code = 0x36;
      }
      else {
        if (local_6c._M_value.kind == Consecutive) goto LAB_004afbbb;
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&syntax->repetition->super_SyntaxNode);
        code.subsystem = Statements;
        code.code = 0x44;
      }
      ASTContext::addDiag(context,code,SVar5);
    }
  }
LAB_004afbbb:
  ASTContext::tryEval((ConstantValue *)&local_58,context,expr);
  local_6d = ConstantValue::isFalse((ConstantValue *)&local_58);
  pSVar4 = BumpAllocator::
           emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::optional<slang::ast::SequenceRepetition>&,bool>
                     (&this->super_BumpAllocator,expr,
                      (optional<slang::ast::SequenceRepetition> *)&local_6c._M_value,&local_6d);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_58);
  return &pSVar4->super_AssertionExpr;
}

Assistant:

AssertionExpr& SimpleAssertionExpr::fromSyntax(const SimpleSequenceExprSyntax& syntax,
                                               const ASTContext& context, bool allowDisable) {
    auto& comp = context.getCompilation();
    auto& expr = bindExpr(*syntax.expr, context, /* allowInstances */ true);

    std::optional<SequenceRepetition> repetition;
    if (syntax.repetition) {
        repetition.emplace(*syntax.repetition, context);

        if (expr.kind == ExpressionKind::AssertionInstance) {
            if (expr.type->isPropertyType())
                context.addDiag(diag::PropInstanceRepetition, syntax.repetition->sourceRange());
            else if (repetition->kind != SequenceRepetition::Consecutive)
                context.addDiag(diag::SeqInstanceRepetition, syntax.repetition->sourceRange());
        }
    }
    else if (expr.kind == ExpressionKind::AssertionInstance && !allowDisable) {
        auto& aie = expr.as<AssertionInstanceExpression>();
        auto targetExpr = &aie.body;
        if (targetExpr->kind == AssertionExprKind::Clocking)
            targetExpr = &targetExpr->as<ClockingAssertionExpr>().expr;

        if (targetExpr->kind == AssertionExprKind::DisableIff) {
            auto& diag = context.addDiag(diag::NestedDisableIff, syntax.sourceRange());
            diag << aie.symbol.name;

            if (targetExpr->syntax) {
                diag.addNote(diag::NoteDeclarationHere,
                             targetExpr->syntax->getFirstToken().location());
            }
        }
    }

    const auto evaluatedValue = context.tryEval(expr);
    return *comp.emplace<SimpleAssertionExpr>(expr, repetition, evaluatedValue.isFalse());
}